

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv_sleep(uint msec)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  undefined1 auStack_20 [4];
  int rc;
  timespec timeout;
  uint msec_local;
  
  _auStack_20 = (ulong)msec / 1000;
  timeout.tv_sec = (__time_t)((msec % 1000) * 1000000);
  timeout.tv_nsec._4_4_ = msec;
  do {
    iVar1 = nanosleep((timespec *)auStack_20,(timespec *)auStack_20);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("rc == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/core.c"
                ,0x5ee,"void uv_sleep(unsigned int)");
}

Assistant:

void uv_sleep(unsigned int msec) {
  struct timespec timeout;
  int rc;

  timeout.tv_sec = msec / 1000;
  timeout.tv_nsec = (msec % 1000) * 1000 * 1000;

  do
    rc = nanosleep(&timeout, &timeout);
  while (rc == -1 && errno == EINTR);

  assert(rc == 0);
}